

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::memberQualifierCheck(TParseContext *this,TPublicType *publicType)

{
  undefined1 *puVar1;
  TSourceLoc *loc;
  
  loc = &publicType->loc;
  globalQualifierFixCheck(this,loc,&publicType->qualifier,true,(TPublicType *)0x0);
  checkNoShaderLayouts(this,loc,&publicType->shaderQualifiers);
  if (((publicType->qualifier).field_0xc & 2) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"not allowed on block or structure members","nonuniformEXT","");
    puVar1 = &(publicType->qualifier).field_0xc;
    *puVar1 = *puVar1 & 0xfd;
  }
  return;
}

Assistant:

void TParseContext::memberQualifierCheck(glslang::TPublicType& publicType)
{
    globalQualifierFixCheck(publicType.loc, publicType.qualifier, true);
    checkNoShaderLayouts(publicType.loc, publicType.shaderQualifiers);
    if (publicType.qualifier.isNonUniform()) {
        error(publicType.loc, "not allowed on block or structure members", "nonuniformEXT", "");
        publicType.qualifier.nonUniform = false;
    }
}